

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::divF32x4(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  long lVar1;
  Literal *this_01;
  undefined1 local_100 [8];
  LaneArray<4> other_lanes;
  LaneArray<4> lanes;
  
  getLanesF32x4((LaneArray<4> *)&other_lanes._M_elems[3].type,this);
  getLanesF32x4((LaneArray<4> *)local_100,other);
  lVar1 = 0;
  this_00 = &lanes._M_elems[3].type;
  do {
    this_01 = (Literal *)((long)&other_lanes._M_elems[3].type.id + lVar1);
    div((Literal *)this_00,(int)this_01,(int)local_100 + (int)lVar1);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  Literal(__return_storage_ptr__,(LaneArray<4> *)&other_lanes._M_elems[3].type);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)(local_100 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)((long)&other_lanes._M_elems[3].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::divF32x4(const Literal& other) const {
  return binary<4, &Literal::getLanesF32x4, &Literal::div>(*this, other);
}